

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void __thiscall xs::MessageWriter::put<int>(MessageWriter *this,int value)

{
  size_type __n;
  reference dst;
  size_t curPos;
  int netValue;
  int value_local;
  MessageWriter *this_local;
  
  curPos._4_4_ = value;
  _netValue = this;
  curPos._0_4_ = hostToNetwork<int>(value);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this->m_buf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this->m_buf,__n + 4);
  dst = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->m_buf,__n);
  deMemcpy(dst,&curPos,4);
  return;
}

Assistant:

void put (T value)
	{
		T netValue = hostToNetwork(value);
		size_t curPos = m_buf.size();
		m_buf.resize(curPos + sizeof(T));
		deMemcpy(&m_buf[curPos], &netValue, sizeof(T));
	}